

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

int Cut_CellTruthLookup(uint *pTruth,int nVars)

{
  uint *pInOut;
  long lVar1;
  long lVar2;
  Cut_CMan_t *pCVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  Cut_Cell_t *pTemp;
  Cut_Cell_t Cell;
  long *local_c0;
  Cut_Cell_t local_b8;
  
  pCVar3 = s_pCMan;
  if (s_pCMan == (Cut_CMan_t *)0x0) {
    puts("Cut_CellTruthLookup: Cell manager is not defined.");
  }
  else {
    memset(&local_b8,0,0x98);
    local_b8._32_4_ = local_b8._32_4_ & 0xfffffff0 | nVars & 0xfU;
    pInOut = local_b8.uTruth;
    uVar4 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar4 = 1;
    }
    if (0 < (int)uVar4) {
      memcpy(pInOut,pTruth,(ulong)uVar4 << 2);
    }
    Cut_CellSuppMin(&local_b8);
    uVar4 = local_b8._32_4_ & 0xf;
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        local_b8.CanonPerm[uVar6] = (char)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    uVar4 = Extra_TruthSemiCanonicize(pInOut,pCVar3->puAux,uVar4,local_b8.CanonPerm,local_b8.Store);
    iVar5 = 1 << ((char)(local_b8._32_4_ & 0xf) - 5U & 0x1f);
    if ((local_b8._32_4_ & 0xf) < 6) {
      iVar5 = 1;
    }
    local_b8._32_4_ = local_b8._32_4_ & 0x3fff | uVar4 << 0xe;
    uVar4 = Extra_TruthHash(pInOut,iVar5);
    iVar5 = st__lookup(pCVar3->tTable,(char *)(ulong)uVar4,(char **)&local_c0);
    if ((iVar5 != 0) && (local_c0 != (long *)0x0)) {
      local_b8._32_4_ = local_b8._32_4_ & 0xf;
      uVar6 = (ulong)(uint)(1 << ((char)local_b8._32_4_ - 5U & 0x1f));
      if ((uint)local_b8._32_4_ < 6) {
        uVar6 = 1;
      }
      do {
        uVar7 = uVar6;
        if ((*(uint *)(local_c0 + 4) & 0xf) == local_b8._32_4_) {
          do {
            iVar5 = (int)uVar7;
            if (iVar5 < 1) goto LAB_004517ce;
            lVar1 = uVar7 * 4;
            lVar2 = uVar7 - 1;
            uVar7 = uVar7 - 1;
          } while (*(uint *)((long)local_c0 + lVar1 + 0x50) == local_b8.uTruth[lVar2]);
          if (iVar5 < 1) {
LAB_004517ce:
            *(int *)(local_c0 + 3) = (int)local_c0[3] + 1;
            pCVar3->nCellFound = pCVar3->nCellFound + 1;
            return 1;
          }
        }
        local_c0 = (long *)*local_c0;
      } while (local_c0 != (long *)0x0);
    }
    pCVar3->nCellNotFound = pCVar3->nCellNotFound + 1;
  }
  return 0;
}

Assistant:

int Cut_CellTruthLookup( unsigned * pTruth, int nVars )
{
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    Cut_Cell_t Cell, * pCell = &Cell;
    unsigned Hash;
    int i;

    // cell manager is not defined
    if ( p == NULL )
    {
        printf( "Cut_CellTruthLookup: Cell manager is not defined.\n" );
        return 0;
    }

    // canonicize
    memset( pCell, 0, sizeof(Cut_Cell_t) );
    pCell->nVars = nVars;
    Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
    Cut_CellSuppMin( pCell );
    // set the elementary permutation
    for ( i = 0; i < (int)pCell->nVars; i++ )
        pCell->CanonPerm[i] = i;
    // canonicize
    pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );


    // check if the cell exists
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum(pCell->nVars) );
    if ( st__lookup( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char **)&pTemp ) )
    {
        for ( ; pTemp; pTemp = pTemp->pNext )
        {
            if ( pTemp->nVars != pCell->nVars )
                continue;
            if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            {
                pTemp->nUsed++;
                p->nCellFound++;
                return 1;
            }
        }
    }
    p->nCellNotFound++;
    return 0;
}